

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader.h
# Opt level: O0

void __thiscall
hiberlite::LoadBean::act<hiberlite::AVisitor<hiberlite::LoadBean>,std::__cxx11::string>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av,
          db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *atom)

{
  int iVar1;
  reference res;
  Scope local_90;
  undefined1 local_48 [44];
  int col_indx;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *atom_local;
  AVisitor<hiberlite::LoadBean> *av_local;
  LoadBean *this_local;
  
  unique0x100000cb = atom;
  atom_local = (db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)av;
  av_local = (AVisitor<hiberlite::LoadBean> *)this;
  AVisitor<hiberlite::LoadBean>::getScope(&local_90,av);
  Scope::prefix_abi_cxx11_((Scope *)local_48);
  iVar1 = locateCol(this,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  Scope::~Scope(&local_90);
  local_48._36_4_ = iVar1;
  res = std::
        stack<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>_>
        ::top(&this->stmt);
  db_atom<std::__cxx11::string>::loadValue<hiberlite::SQLiteSelect,int>
            ((db_atom<std::__cxx11::string> *)atom,&res->first,(int *)(local_48 + 0x24));
  return;
}

Assistant:

inline void act(AV& av, db_atom<C> atom){
			int col_indx=locateCol(av.getScope().prefix());
			atom.loadValue(stmt.top().first, col_indx);
		}